

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_label.c
# Opt level: O0

void HTS_Label_check_time(HTS_Label *label)

{
  HTS_LabelString *pHVar1;
  HTS_LabelString *next;
  HTS_LabelString *lstring;
  HTS_Label *label_local;
  
  pHVar1 = label->head;
  if (pHVar1 != (HTS_LabelString *)0x0) {
    pHVar1->start = 0.0;
  }
  while ((lstring = pHVar1, lstring != (HTS_LabelString *)0x0 &&
         (pHVar1 = lstring->next, pHVar1 != (_HTS_LabelString *)0x0))) {
    if ((0.0 < lstring->end || lstring->end == 0.0) || (pHVar1->start < 0.0)) {
      if ((0.0 <= lstring->end) && (pHVar1->start <= 0.0 && pHVar1->start != 0.0)) {
        pHVar1->start = lstring->end;
      }
    }
    else {
      lstring->end = pHVar1->start;
    }
    if (lstring->start <= 0.0 && lstring->start != 0.0) {
      lstring->start = -1.0;
    }
    if (lstring->end <= 0.0 && lstring->end != 0.0) {
      lstring->end = -1.0;
    }
  }
  return;
}

Assistant:

static void HTS_Label_check_time(HTS_Label * label)
{
   HTS_LabelString *lstring = label->head;
   HTS_LabelString *next = NULL;

   if (lstring)
      lstring->start = 0.0;
   while (lstring) {
      next = lstring->next;
      if (!next)
         break;
      if (lstring->end < 0.0 && next->start >= 0.0)
         lstring->end = next->start;
      else if (lstring->end >= 0.0 && next->start < 0.0)
         next->start = lstring->end;
      if (lstring->start < 0.0)
         lstring->start = -1.0;
      if (lstring->end < 0.0)
         lstring->end = -1.0;
      lstring = next;
   }
}